

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

void xmlFAReduceEpsilonTransitions(xmlRegParserCtxtPtr ctxt,int fromnr,int tonr,int counter)

{
  xmlRegStatePtr state;
  xmlRegStatePtr pxVar1;
  xmlRegTrans *pxVar2;
  xmlRegStatePtr target;
  long lVar3;
  xmlRegAtomPtr atom;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  state = ctxt->states[(uint)fromnr];
  if (((state != (xmlRegStatePtr)0x0) &&
      (pxVar1 = ctxt->states[(uint)tonr], pxVar1 != (xmlRegStatePtr)0x0)) &&
     (1 < pxVar1->mark - XML_REGEXP_MARK_START)) {
    pxVar1->mark = XML_REGEXP_MARK_VISITED;
    if (pxVar1->type == XML_REGEXP_FINAL_STATE) {
      state->type = XML_REGEXP_FINAL_STATE;
    }
    if (0 < pxVar1->nbTrans) {
      lVar7 = 0x10;
      lVar4 = 0;
      do {
        pxVar2 = pxVar1->trans;
        iVar5 = *(int *)((long)pxVar2 + lVar7 + -8);
        lVar3 = (long)iVar5;
        if (-1 < lVar3) {
          atom = *(xmlRegAtomPtr *)((long)pxVar2 + lVar7 + -0x10);
          if (atom == (xmlRegAtomPtr)0x0) {
            if (iVar5 != fromnr) {
              iVar6 = *(int *)((long)&pxVar2->atom + lVar7);
              if (-1 < iVar6) {
                target = ctxt->states[lVar3];
                atom = (xmlRegAtomPtr)0x0;
                iVar5 = -1;
                goto LAB_001a6390;
              }
              iVar6 = *(int *)((long)pxVar2 + lVar7 + -4);
              if (iVar6 < 0) {
                iVar6 = counter;
              }
              xmlFAReduceEpsilonTransitions(ctxt,fromnr,iVar5,iVar6);
            }
          }
          else {
            iVar5 = *(int *)((long)pxVar2 + lVar7 + -4);
            target = ctxt->states[lVar3];
            if (iVar5 < 0) {
              iVar5 = counter;
            }
            iVar6 = -1;
LAB_001a6390:
            xmlRegStateAddTrans(ctxt,state,atom,target,iVar5,iVar6);
          }
        }
        lVar4 = lVar4 + 1;
        lVar7 = lVar7 + 0x18;
      } while (lVar4 < pxVar1->nbTrans);
    }
    pxVar1->mark = XML_REGEXP_MARK_NORMAL;
  }
  return;
}

Assistant:

static void
xmlFAReduceEpsilonTransitions(xmlRegParserCtxtPtr ctxt, int fromnr,
	                      int tonr, int counter) {
    int transnr;
    xmlRegStatePtr from;
    xmlRegStatePtr to;

#ifdef DEBUG_REGEXP_GRAPH
    printf("xmlFAReduceEpsilonTransitions(%d, %d)\n", fromnr, tonr);
#endif
    from = ctxt->states[fromnr];
    if (from == NULL)
	return;
    to = ctxt->states[tonr];
    if (to == NULL)
	return;
    if ((to->mark == XML_REGEXP_MARK_START) ||
	(to->mark == XML_REGEXP_MARK_VISITED))
	return;

    to->mark = XML_REGEXP_MARK_VISITED;
    if (to->type == XML_REGEXP_FINAL_STATE) {
#ifdef DEBUG_REGEXP_GRAPH
	printf("State %d is final, so %d becomes final\n", tonr, fromnr);
#endif
	from->type = XML_REGEXP_FINAL_STATE;
    }
    for (transnr = 0;transnr < to->nbTrans;transnr++) {
        if (to->trans[transnr].to < 0)
	    continue;
	if (to->trans[transnr].atom == NULL) {
	    /*
	     * Don't remove counted transitions
	     * Don't loop either
	     */
	    if (to->trans[transnr].to != fromnr) {
		if (to->trans[transnr].count >= 0) {
		    int newto = to->trans[transnr].to;

		    xmlRegStateAddTrans(ctxt, from, NULL,
					ctxt->states[newto],
					-1, to->trans[transnr].count);
		} else {
#ifdef DEBUG_REGEXP_GRAPH
		    printf("Found epsilon trans %d from %d to %d\n",
			   transnr, tonr, to->trans[transnr].to);
#endif
		    if (to->trans[transnr].counter >= 0) {
			xmlFAReduceEpsilonTransitions(ctxt, fromnr,
					      to->trans[transnr].to,
					      to->trans[transnr].counter);
		    } else {
			xmlFAReduceEpsilonTransitions(ctxt, fromnr,
					      to->trans[transnr].to,
					      counter);
		    }
		}
	    }
	} else {
	    int newto = to->trans[transnr].to;

	    if (to->trans[transnr].counter >= 0) {
		xmlRegStateAddTrans(ctxt, from, to->trans[transnr].atom,
				    ctxt->states[newto],
				    to->trans[transnr].counter, -1);
	    } else {
		xmlRegStateAddTrans(ctxt, from, to->trans[transnr].atom,
				    ctxt->states[newto], counter, -1);
	    }
	}
    }
    to->mark = XML_REGEXP_MARK_NORMAL;
}